

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::syntax::VariableDimensionSyntax*>::
emplace_back<slang::syntax::VariableDimensionSyntax*>
          (SmallVectorBase<slang::syntax::VariableDimensionSyntax*> *this,
          VariableDimensionSyntax **args)

{
  long lVar1;
  reference ppVVar2;
  pointer ppVVar3;
  
  lVar1 = *(long *)(this + 8);
  ppVVar3 = (pointer)(lVar1 * 8 + *(long *)this);
  if (lVar1 == *(long *)(this + 0x10)) {
    ppVVar3 = emplaceRealloc<slang::syntax::VariableDimensionSyntax*>(this,ppVVar3,args);
    return ppVVar3;
  }
  *ppVVar3 = *args;
  *(long *)(this + 8) = lVar1 + 1;
  ppVVar2 = SmallVectorBase<slang::syntax::VariableDimensionSyntax_*>::back
                      ((SmallVectorBase<slang::syntax::VariableDimensionSyntax_*> *)this);
  return ppVVar2;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }